

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O0

bool32 rw::d3d::imageFindRasterFormat
                 (Image *img,int32 type,int32 *pWidth,int32 *pHeight,int32 *pDepth,int32 *pFormat)

{
  int32 iVar1;
  int32 iVar2;
  FILE *__stream;
  bool32 bVar3;
  char *pcVar4;
  Error local_58;
  Error _e;
  int32 format;
  int32 depth;
  int32 height;
  int32 width;
  int32 *pFormat_local;
  int32 *pDepth_local;
  int32 *pHeight_local;
  int32 *pWidth_local;
  int32 type_local;
  Image *img_local;
  
  iVar1 = img->width;
  iVar2 = img->height;
  _e.code = img->depth;
  if (((int)_e.code < 9) && (isP8supported == 0)) {
    _e.code = 0x20;
  }
  switch(_e.code) {
  case 4:
    _e.plugin = 0x4500;
    break;
  default:
    local_58.plugin = 0xb00;
    local_58.code = 0x8000000a;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d.cpp",0x2c7);
    __stream = _stderr;
    pcVar4 = dbgsprint(0x8000000a);
    fprintf(__stream,"%s\n",pcVar4);
    setError(&local_58);
    return 0;
  case 8:
    _e.plugin = 0x2500;
    break;
  case 0x10:
    _e.plugin = 0x100;
    break;
  case 0x18:
    _e.plugin = 0x600;
    break;
  case 0x20:
    bVar3 = Image::hasAlpha(img);
    if (bVar3 == 0) {
      _e.plugin = 0x600;
      _e.code = 0x18;
    }
    else {
      _e.plugin = 0x500;
    }
  }
  *pWidth = iVar1;
  *pHeight = iVar2;
  *pDepth = _e.code;
  *pFormat = type | _e.plugin;
  return 1;
}

Assistant:

bool32
imageFindRasterFormat(Image *img, int32 type,
	int32 *pWidth, int32 *pHeight, int32 *pDepth, int32 *pFormat)
{
	int32 width, height, depth, format;

	assert((type&0xF) == Raster::TEXTURE);

//	for(width = 1; width < img->width; width <<= 1);
//	for(height = 1; height < img->height; height <<= 1);
	// Perhaps non-power-of-2 textures are acceptable?
	width = img->width;
	height = img->height;

	depth = img->depth;

	if(depth <= 8 && !isP8supported)
		depth = 32;

	switch(depth){
	case 32:
		if(img->hasAlpha())
			format = Raster::C8888;
		else{
			format = Raster::C888;
			depth = 24;
		}
		break;
	case 24:
		format = Raster::C888;
		break;
	case 16:
		format = Raster::C1555;
		break;
	case 8:
		format = Raster::PAL8 | Raster::C8888;
		break;
	case 4:
		format = Raster::PAL4 | Raster::C8888;
		break;
	default:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	format |= type;

	*pWidth = width;
	*pHeight = height;
	*pDepth = depth;
	*pFormat = format;

	return 1;
}